

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

Violation __thiscall
mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int iVar2;
  Violation VVar3;
  
  VVar3 = AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-1>>::
          ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    ((AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>> *)(this + 0x28),x,false);
  VVar3.valX_ = VVar3.valX_;
  VVar3.viol_ = VVar3.viol_;
  dVar1 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)(this + 0x20)];
  iVar2 = *(int *)(this + 0x24);
  if (iVar2 == 2) {
    if (dVar1 < 0.5 || VVar3.viol_ <= 0.0) {
      VVar3 = (Violation)ZEXT816(0);
    }
  }
  else if (iVar2 == 3) {
    if (0.0 < VVar3.viol_) {
      VVar3 = (Violation)ZEXT816(0);
    }
    else {
      VVar3 = (Violation)ZEXT816(0);
      if (dVar1 < 0.5) {
        VVar3.valX_ = VVar3.valX_;
        VVar3.viol_ = -VVar3.viol_;
      }
    }
  }
  else if (iVar2 == 4) {
    VVar3 = (Violation)ZEXT816(0);
    if (VVar3.viol_ <= 0.0 != 0.5 <= dVar1) {
      VVar3.valX_ = VVar3.valX_;
      VVar3.viol_ = ABS(VVar3.viol_);
    }
  }
  else {
    VVar3 = (Violation)ZEXT816(0x7ff0000000000000);
  }
  return VVar3;
}

Assistant:

Violation ComputeViolation(const VarVec& x) {
    auto viol = GetConstraint().ComputeViolation(x);
    bool ccon_valid = viol.viol_<=0.0;
    bool has_arg = x[GetResultVar()] >= 0.5;
    switch (this->GetContext().GetValue()) {
    case Context::CTX_MIX:    // Viol is non-positive if holds
      if (has_arg == ccon_valid)
        return {0.0, 0.0};
      return {std::fabs(viol.viol_), viol.valX_};
    case Context::CTX_POS:
      if (has_arg <= ccon_valid)
        return {0.0, 0.0};
      return {viol.viol_, viol.valX_};
    case Context::CTX_NEG:
      if (has_arg >= ccon_valid)
        return {0.0, 0.0};
      return {-viol.viol_, viol.valX_};
    default:
      return {INFINITY, 0.0};
    }
  }